

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

void __thiscall
Diligent::DescriptorPoolManager::DescriptorPoolManager
          (DescriptorPoolManager *this,RenderDeviceVkImpl *DeviceVkImpl,string *PoolName,
          vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *PoolSizes,
          uint32_t MaxSets,bool AllowFreeing)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *ppVVar3;
  pointer pcVar4;
  element_type *peVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer pVVar9;
  pointer __src;
  pointer __dest;
  
  this->m_DeviceVkImpl = DeviceVkImpl;
  paVar1 = &(this->m_PoolName).field_2;
  (this->m_PoolName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (PoolName->_M_dataplus)._M_p;
  paVar2 = &PoolName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined4 *)((long)&PoolName->field_2 + 4);
    uVar7 = *(undefined4 *)((long)&PoolName->field_2 + 8);
    uVar8 = *(undefined4 *)((long)&PoolName->field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(this->m_PoolName).field_2 + 4) = uVar6;
    *(undefined4 *)((long)&(this->m_PoolName).field_2 + 8) = uVar7;
    *(undefined4 *)((long)&(this->m_PoolName).field_2 + 0xc) = uVar8;
  }
  else {
    (this->m_PoolName)._M_dataplus._M_p = pcVar4;
    (this->m_PoolName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_PoolName)._M_string_length = PoolName->_M_string_length;
  (PoolName->_M_dataplus)._M_p = (pointer)paVar2;
  PoolName->_M_string_length = 0;
  (PoolName->field_2)._M_local_buf[0] = '\0';
  __dest = (PoolSizes->
           super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar9 = (PoolSizes->
           super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__dest != pVVar9) {
    peVar5 = (DeviceVkImpl->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    do {
      if ((__dest->type == VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR) &&
         ((peVar5->m_EnabledExtFeatures).RayTracingPipeline.rayTracingPipeline == 0)) {
        __src = __dest + 1;
        if (__src != pVVar9) {
          memmove(__dest,__src,(long)pVVar9 - (long)__src);
        }
        ppVVar3 = &(PoolSizes->
                   super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppVVar3 = *ppVVar3 + -1;
      }
      else {
        __dest = __dest + 1;
      }
      pVVar9 = (PoolSizes->
               super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    } while (__dest != pVVar9);
  }
  (this->m_PoolSizes).
  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_start =
       (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_PoolSizes).
  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar9;
  (this->m_PoolSizes).
  super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (PoolSizes->super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_MaxSets = MaxSets;
  this->m_AllowFreeing = AllowFreeing;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_Pools).
  super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::_M_initialize_map(&(this->m_Pools).
                       super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                      ,0);
  LOCK();
  (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

DescriptorPoolManager::DescriptorPoolManager(RenderDeviceVkImpl&               DeviceVkImpl,
                                             std::string                       PoolName,
                                             std::vector<VkDescriptorPoolSize> PoolSizes,
                                             uint32_t                          MaxSets,
                                             bool                              AllowFreeing) noexcept :
    // clang-format off
    m_DeviceVkImpl{DeviceVkImpl        },
    m_PoolName    {std::move(PoolName) },
    m_PoolSizes   (PrunePoolSizes(DeviceVkImpl, std::move(PoolSizes))),
    m_MaxSets     {MaxSets             },
    m_AllowFreeing{AllowFreeing        }
// clang-format on
{
#ifdef DILIGENT_DEVELOPMENT
    m_AllocatedPoolCounter = 0;
#endif
}